

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O3

void ShuffleDeck16_Ref(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  uint64_t uVar7;
  
  *deck = 0;
  if (1 < count) {
    uVar7 = prng->State;
    uVar2 = prng->Inc;
    uVar6 = 1;
    do {
      uVar4 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
      bVar5 = (byte)(uVar7 >> 0x3b);
      uVar1 = uVar6 + 1;
      uVar3 = (ulong)(uVar4 >> bVar5 | uVar4 << 0x20 - bVar5) % (uVar1 & 0xffffffff);
      if (uVar6 != uVar3) {
        deck[uVar6] = deck[uVar3];
      }
      deck[uVar3] = (uint16_t)uVar6;
      uVar7 = uVar7 * 0x5851f42d4c957f2d + uVar2;
      uVar6 = uVar1;
    } while (count != uVar1);
    prng->State = uVar7;
  }
  return;
}

Assistant:

void ShuffleDeck16_Ref(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
#if 1

    deck[0] = 0;

    for (unsigned i = 1; i < count; ++i)
    {
        unsigned j = prng.Next() % (i + 1);
        if (j != i) {
            deck[i] = deck[j];
        }
        deck[j] = (uint16_t)i;
    }

#else

    (void)prng;

    for (unsigned i = 0; i < count; ++i)
    {
        deck[i] = (uint16_t)i;
    }

    // This is even slower
    std::random_shuffle(&deck[0], &deck[count]);

#endif
}